

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

int EventFilter20to12(void *data,SDL_Event *event20)

{
  ushort uVar1;
  int iVar2;
  Sint32 SVar3;
  SDL_FingerID SVar4;
  byte bVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  uint uVar8;
  SDL12Key SVar9;
  int iVar10;
  Uint32 UVar11;
  char *pcVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  SDL_atomic_t *pSVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  SDL12_SysWMmsg msg;
  SDL12_Event local_f8;
  undefined1 local_e0 [4];
  undefined4 local_dc;
  undefined1 local_d8 [192];
  
  (*SDL20_memset)(&local_f8,0,0x18);
  uVar7 = local_f8.motion.x._1_1_;
  uVar6 = local_f8.key.keysym.scancode;
  UVar11 = event20->type;
  if (0x5ff < (int)UVar11) {
    switch(UVar11) {
    case 0x600:
      if ((JoysticksAreGameControllers == SDL_FALSE) &&
         (iVar10 = FindJoystick12IndexByInstanceId((event20->jaxis).which),
         uVar6 = local_f8.key.keysym.scancode, uVar7 = local_f8.motion.x._1_1_, iVar10 != -1)) {
        local_f8.active.gain = (Uint8)iVar10;
LAB_001143c0:
        local_f8.type = 7;
        local_f8.active.state = (event20->display).event;
        local_f8.key.keysym.scancode = (Uint8)(event20->jaxis).value;
        local_f8.motion.x._1_1_ = (undefined1)((ushort)(event20->jaxis).value >> 8);
        uVar6 = local_f8.key.keysym.scancode;
        uVar7 = local_f8.motion.x._1_1_;
      }
      break;
    case 0x601:
      if ((JoysticksAreGameControllers == SDL_FALSE) &&
         (iVar10 = FindJoystick12IndexByInstanceId((event20->jaxis).which),
         uVar6 = local_f8.key.keysym.scancode, uVar7 = local_f8.motion.x._1_1_, iVar10 != -1)) {
        local_f8.active.gain = (char)iVar10;
        local_f8.type = 8;
        local_f8.active.state = (event20->display).event;
        SVar3 = (event20->display).data1;
        local_f8.key.keysym.scancode = (Uint8)SVar3;
        local_f8.motion.x._1_1_ = (undefined1)((uint)SVar3 >> 8);
        local_f8.motion.y = (Uint16)((uint)SVar3 >> 0x10);
        uVar6 = local_f8.key.keysym.scancode;
        uVar7 = local_f8.motion.x._1_1_;
      }
      break;
    case 0x602:
      if ((JoysticksAreGameControllers == SDL_FALSE) &&
         (iVar10 = FindJoystick12IndexByInstanceId((event20->jaxis).which),
         uVar6 = local_f8.key.keysym.scancode, uVar7 = local_f8.motion.x._1_1_, iVar10 != -1)) {
        local_f8.active.gain = (char)iVar10;
        local_f8.type = 9;
        local_f8.active.state = (event20->display).event;
        local_f8.button.state = (event20->display).padding1;
      }
      break;
    case 0x603:
    case 0x604:
      if ((JoysticksAreGameControllers == SDL_FALSE) && (0 < (long)NumJoysticks)) {
        pSVar16 = &JoystickList->refcount;
        lVar13 = 0;
        do {
          if (*(Uint32 *)(pSVar16 + 1) == (event20->display).display) goto LAB_00114356;
          lVar13 = lVar13 + 1;
          pSVar16 = pSVar16 + 6;
        } while (NumJoysticks != lVar13);
      }
      break;
    default:
      if (UVar11 - 0x651 < 2) {
        if ((JoysticksAreGameControllers != SDL_FALSE) && (0 < (long)NumJoysticks)) {
          pSVar16 = &JoystickList->refcount;
          lVar13 = 0;
          do {
            if (*(Uint32 *)(pSVar16 + 1) == (event20->display).display) goto LAB_00114356;
            lVar13 = lVar13 + 1;
            pSVar16 = pSVar16 + 6;
          } while (NumJoysticks != lVar13);
        }
      }
      else {
        if (UVar11 != 0x650) {
          return 1;
        }
        if ((JoysticksAreGameControllers != SDL_FALSE) && (0 < (long)NumJoysticks)) {
          pSVar16 = &JoystickList->refcount;
          lVar13 = 0;
          do {
            if (*(Uint32 *)(pSVar16 + 1) == (event20->display).display) {
              iVar10 = (*SDL20_AtomicGet)(pSVar16);
              uVar6 = local_f8.key.keysym.scancode;
              uVar7 = local_f8.motion.x._1_1_;
              if (0 < iVar10) {
                local_f8.active.gain = (Uint8)lVar13;
                goto LAB_001143c0;
              }
              break;
            }
            lVar13 = lVar13 + 1;
            pSVar16 = pSVar16 + 6;
          } while (NumJoysticks != lVar13);
        }
      }
    }
    goto switchD_00113edb_caseD_2;
  }
  if ((int)UVar11 < 0x301) {
    if (0x200 < (int)UVar11) {
      if (UVar11 == 0x201) {
        if (SupportSysWM == SDL_FALSE) {
          return 1;
        }
        local_dc = 0;
        (*SDL20_memcpy)(local_d8,&((event20->syswm).msg)->msg,0xc0);
        (*SDL20_memcpy)(local_e0,&SDL_Linked_Version::version,3);
        local_f8.type = 0xd;
        local_f8.motion.xrel = (Sint16)local_e0;
        local_f8.motion.yrel = (Sint16)((ulong)local_e0 >> 0x10);
        local_f8.key.keysym.mod = (uint)((ulong)local_e0 >> 0x20);
        uVar6 = local_f8.key.keysym.scancode;
        uVar7 = local_f8.motion.x._1_1_;
        goto switchD_00113edb_caseD_2;
      }
      if (UVar11 != 0x300) {
        return 1;
      }
      FlushPendingKeydownEvent(0);
      if ((event20->display).padding1 != '\0') {
        return 1;
      }
      if (TranslateKeyboardLayout == SDL_FALSE) {
        SVar9 = Scancode20toKeysym12((event20->key).keysym.scancode);
      }
      else {
        SVar9 = Keysym20to12((event20->window).data2);
      }
      PendingKeydownEvent.active.state = (event20->display).event;
      PendingKeydownEvent.key.keysym.sym = SVar9;
      KeyState[SVar9] = PendingKeydownEvent.active.state;
      PendingKeydownEvent.type = event20->type == 0x300 ^ 3;
      PendingKeydownEvent.active.gain = '\0';
      PendingKeydownEvent.key.keysym.scancode = Scancode20to12((event20->key).keysym.scancode);
      uVar1 = (event20->key).keysym.mod;
      PendingKeydownEvent.key.keysym.mod = (uint)uVar1;
      PendingKeydownEvent.key.keysym.unicode = 0;
      if (EnabledUnicode != 0) {
        if (0xc < (int)SVar9) {
          if (SVar9 != SDLK12_RETURN) {
            if (SVar9 == SDLK12_ESCAPE) {
              uVar15 = 0x1b;
              goto LAB_001145e6;
            }
            if (SVar9 != SDLK12_KP_ENTER) goto LAB_001145cc;
          }
          if ((uVar1 & 3) == 0) {
            uVar15 = 0xd;
          }
          else {
            uVar15 = 10;
          }
          goto LAB_001145e6;
        }
        if (SVar9 == SDLK12_BACKSPACE) {
          uVar15 = 8;
          goto LAB_001145e6;
        }
        if (SVar9 == SDLK12_TAB) {
          uVar15 = 9;
          goto LAB_001145e6;
        }
LAB_001145cc:
        if ((uVar1 & 0xc0) == 0) {
          PendingKeydownEvent.key.keysym.unicode = 0;
          return 1;
        }
        pcVar12 = SDL_GetKeyName(SVar9);
        uVar15 = (uint)*pcVar12;
        if ((uVar15 != 0) && (pcVar12[1] == '\0')) goto LAB_001145e6;
      }
      uVar15 = 0;
LAB_001145e6:
      FlushPendingKeydownEvent(uVar15);
      return 1;
    }
    if (UVar11 == 0x100) {
      local_f8.type = 0xc;
      goto switchD_00113edb_caseD_2;
    }
    if (UVar11 != 0x200) {
      return 1;
    }
    if (VideoWindow20 == (SDL_Window *)0x0) goto switchD_00113edb_caseD_2;
    switch((event20->display).event) {
    case '\x01':
    case '\x03':
      if (SetVideoModeInProgress == '\0') {
        local_f8.type = 0x11;
      }
      break;
    case '\x05':
      UVar11 = (*SDL20_GetWindowFlags)(VideoWindow20);
      uVar6 = local_f8.key.keysym.scancode;
      uVar7 = local_f8.motion.x._1_1_;
      if ((~UVar11 & 0x1001) != 0) {
        local_f8.type = 0x10;
        SVar4 = (event20->tfinger).fingerId;
        local_f8.key.keysym.scancode = (Uint8)SVar4;
        local_f8.motion.x._1_1_ = (undefined1)((ulong)SVar4 >> 8);
        local_f8.motion.y = (Uint16)((ulong)SVar4 >> 0x10);
        local_f8.motion.xrel = (Sint16)((ulong)SVar4 >> 0x20);
        local_f8.motion.yrel = (Sint16)((ulong)SVar4 >> 0x30);
        uVar6 = local_f8.key.keysym.scancode;
        uVar7 = local_f8.motion.x._1_1_;
      }
      break;
    case '\a':
      local_f8._0_2_ = 1;
      goto LAB_00114586;
    case '\t':
      local_f8._0_2_ = 0x101;
LAB_00114586:
      local_f8.active.state = 4;
      break;
    case '\n':
      local_f8._0_2_ = 0x101;
      goto LAB_001145a0;
    case '\v':
      local_f8._0_2_ = 1;
LAB_001145a0:
      local_f8.active.state = 1;
      break;
    case '\f':
      local_f8._0_2_ = 0x101;
      goto LAB_00114593;
    case '\r':
      local_f8._0_2_ = 1;
LAB_00114593:
      local_f8.active.state = 2;
    }
    goto switchD_00113edb_caseD_2;
  }
  local_f8.key.keysym.scancode = (Uint8)_MousePosition_0;
  local_f8.motion.x._1_1_ = (undefined1)(_MousePosition_0 >> 8);
  switch(UVar11) {
  case 0x400:
    if (VideoSurface12 == (SDL12_Surface *)0x0) {
      return 1;
    }
    if (VideoSurface12Location.surface20 == (SDL_Surface *)0x0) {
      return 1;
    }
    local_f8.active.gain = (event20->display).event;
    local_f8.type = 4;
    local_f8.active.state = (event20->edit).text[4];
    AdjustOpenGLLogicalScalingPoint(&(event20->window).data2,(int *)((event20->edit).text + 0xc));
    uVar15 = (event20->motion).y;
    uVar8 = VideoSurface12Location.w;
    if ((event20->window).data2 < VideoSurface12Location.w) {
      uVar8 = (event20->window).data2;
    }
    if ((int)uVar8 < 1) {
      uVar8 = 0;
    }
    (event20->window).data2 = uVar8;
    uVar14 = VideoSurface12Location.h;
    if ((int)uVar15 < VideoSurface12Location.h) {
      uVar14 = uVar15;
    }
    if ((int)uVar14 < 1) {
      uVar14 = 0;
    }
    (event20->motion).y = uVar14;
    local_f8.key.keysym.scancode = (Uint8)uVar8;
    local_f8.motion.x._1_1_ = (undefined1)(uVar8 >> 8);
    local_f8.motion.y = (Uint16)uVar14;
    if (UseMouseRelativeScaling != SDL_FALSE) {
      AdjustOpenGLLogicalScalingVector
                ((int *)((event20->edit).text + 0x10),(int *)((event20->edit).text + 0x14),
                 (float *)(ulong)uVar15,(float *)0x0);
    }
    iVar10 = (event20->motion).xrel;
    local_f8.motion.xrel = (Sint16)iVar10;
    iVar2 = (event20->motion).yrel;
    local_f8.motion.yrel = (Sint16)iVar2;
    if (MouseInputIsRelative == SDL_FALSE) {
      _MousePosition_0 = (uint)CONCAT11(local_f8.motion.x._1_1_,local_f8.key.keysym.scancode);
      _MousePosition_1 = (uint)local_f8.motion.y;
      uVar6 = local_f8.key.keysym.scancode;
      uVar7 = local_f8.motion.x._1_1_;
    }
    else {
      bVar17 = SCARRY4(iVar10,_MousePosition_0);
      _MousePosition_0 = iVar10 + _MousePosition_0;
      if (_MousePosition_0 == 0 || bVar17 != (int)_MousePosition_0 < 0) {
        _MousePosition_0 = 0;
      }
      else if (VideoSurface12Location.w <= (int)_MousePosition_0) {
        _MousePosition_0 = VideoSurface12Location.w - 1;
      }
      local_f8.key.keysym.scancode = (Uint8)_MousePosition_0;
      local_f8.motion.x._1_1_ = (undefined1)(_MousePosition_0 >> 8);
      bVar17 = SCARRY4(iVar2,_MousePosition_1);
      _MousePosition_1 = iVar2 + _MousePosition_1;
      if (_MousePosition_1 == 0 || bVar17 != (int)_MousePosition_1 < 0) {
        _MousePosition_1 = 0;
      }
      else if (VideoSurface12Location.h <= (int)_MousePosition_1) {
        _MousePosition_1 = VideoSurface12Location.h - 1;
      }
      uVar6 = local_f8.key.keysym.scancode;
      uVar7 = local_f8.motion.x._1_1_;
      local_f8.motion.y = (ushort)_MousePosition_1;
    }
    break;
  case 0x401:
    local_f8.type = '\x05';
    goto LAB_00114310;
  case 0x402:
    local_f8.type = '\x06';
LAB_00114310:
    local_f8.active.gain = (event20->display).event;
    bVar5 = (byte)(event20->key).keysym.scancode;
    local_f8.active.state = bVar5 + 2;
    if (bVar5 < 4) {
      local_f8.active.state = bVar5;
    }
    local_f8.button.state = (event20->edit).text[5];
    uVar6 = local_f8.key.keysym.scancode;
    uVar7 = local_f8.motion.x._1_1_;
    local_f8.motion.y = (ushort)_MousePosition_1;
    if (MouseInputIsRelative == SDL_FALSE) {
      AdjustOpenGLLogicalScalingPoint(&(event20->window).data2,(int *)((event20->edit).text + 0xc));
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)((long)&(event20->tfinger).fingerId + 4);
      auVar18 = pshuflw(auVar18,auVar18,0xe8);
      local_f8.key.keysym.scancode = auVar18[0];
      local_f8.motion.x._1_1_ = auVar18[1];
      local_f8.motion.y = auVar18._2_2_;
      uVar6 = local_f8.key.keysym.scancode;
      uVar7 = local_f8.motion.x._1_1_;
    }
    break;
  case 0x403:
    if ((event20->window).data2 != 0) {
      local_f8.active.gain = (event20->display).event;
      local_f8.type = '\x05';
      local_f8.active.state = 0 < (event20->window).data2 ^ 5;
      local_f8.button.state = '\x01';
      local_f8.motion.y = (ushort)_MousePosition_1;
      PushEventIfNotFiltered(&local_f8);
      local_f8.type = 6;
      local_f8.button.state = '\0';
      uVar6 = local_f8.key.keysym.scancode;
      uVar7 = local_f8.motion.x._1_1_;
    }
    break;
  default:
    if (UVar11 != 0x301) {
      if (UVar11 != 0x303) {
        return 1;
      }
      uVar15 = (uint)(event20->display).event;
      uVar8 = 0x1f;
      if (~(uVar15 << 0x18) != 0) {
        for (; ~(uVar15 << 0x18) >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = uVar8 ^ 0x1f;
      if ((event20->display).event == 0) {
        uVar8 = uVar15;
      }
      uVar15 = ~(-1 << (8U - (char)uVar8 & 0x1f)) & uVar15;
      if (1 < uVar8) {
        lVar13 = 0;
        do {
          uVar15 = uVar15 << 6 | event20->padding[lVar13 + 0xd] & 0x3f;
          lVar13 = lVar13 + 1;
        } while (uVar8 - 1 != (int)lVar13);
      }
      goto LAB_001145e6;
    }
    if ((event20->display).padding1 != '\0') {
      return 1;
    }
    local_f8.motion.x._1_1_ = uVar7;
    if (TranslateKeyboardLayout == SDL_FALSE) {
      SVar9 = Scancode20toKeysym12((event20->key).keysym.scancode);
    }
    else {
      SVar9 = Keysym20to12((event20->window).data2);
    }
    local_f8.motion.xrel = (Sint16)SVar9;
    local_f8.motion.yrel = (Sint16)(SVar9 >> 0x10);
    if ((KeyRepeatNextTicks != 0) && (KeyRepeatEvent.key.keysym.sym == SVar9)) {
      KeyRepeatNextTicks = 0;
    }
    local_f8.active.state = (event20->display).event;
    KeyState[SVar9] = local_f8.active.state;
    local_f8._0_2_ = 3;
    local_f8.key.keysym.scancode = Scancode20to12((event20->key).keysym.scancode);
    local_f8.key.keysym.mod = (uint)(event20->key).keysym.mod;
    local_f8.key.keysym.unicode = 0;
    FlushPendingKeydownEvent(0);
    uVar6 = local_f8.key.keysym.scancode;
    uVar7 = local_f8.motion.x._1_1_;
  }
switchD_00113edb_caseD_2:
  local_f8.motion.x._1_1_ = uVar7;
  local_f8.key.keysym.scancode = uVar6;
  PushEventIfNotFiltered(&local_f8);
  return 1;
LAB_00114356:
  iVar10 = (*SDL20_AtomicGet)(pSVar16);
  uVar6 = local_f8.key.keysym.scancode;
  uVar7 = local_f8.motion.x._1_1_;
  if (0 < iVar10) {
    local_f8.button.state = (event20->display).padding1;
    local_f8._0_2_ = CONCAT11((char)lVar13,local_f8.button.state == '\0') | 10;
    local_f8.active.state = (event20->display).event;
  }
  goto switchD_00113edb_caseD_2;
}

Assistant:

static int SDLCALL
EventFilter20to12(void *data, SDL_Event *event20)
{
    SDL12_Event event12;
    SDL12_SysWMmsg msg;

    SDL_assert(data == NULL);  /* currently unused. */

    SDL20_zero(event12);

    switch (event20->type) {
        case SDL_QUIT:
            event12.type = SDL12_QUIT;
            break;

        case SDL_WINDOWEVENT:
            if (!VideoWindow20) {
                break;  /* no window? No event. */
            }

            switch (event20->window.event) {
                /* don't send an SDL12_QUIT event for SDL_WINDOWEVENT_CLOSE;
                   we only ever have a single window, so an SDL_QUIT will be
                   coming from SDL2 next anyhow, so just send that on. */

                case SDL_WINDOWEVENT_SHOWN:
                case SDL_WINDOWEVENT_EXPOSED:
                    /* drop these during window creation (see issue #229) */
                    if (!SetVideoModeInProgress) {
                        event12.type = SDL12_VIDEOEXPOSE;
                    }
                    break;

                case SDL_WINDOWEVENT_RESIZED: {
                    /* don't generate a VIDEORESIZE event based on SIZE_CHANGED
                       events: the recommended way to handle VIDEORESIZE is
                       with a new SDL_SetVideoMode() call, and creating a new
                       window generates a SIZE_CHANGED event, which leads to an
                       infinite loop. */

                    /* don't report VIDEORESIZE if we're fullscreen-desktop;
                       we're doing logical scaling and as far as the app is
                       concerned the window doesn't change. */
                    const Uint32 flags = SDL20_GetWindowFlags(VideoWindow20);
                    if ((flags & SDL_WINDOW_FULLSCREEN_DESKTOP) == SDL_WINDOW_FULLSCREEN_DESKTOP) {
                        break;
                    }

                    event12.type = SDL12_VIDEORESIZE;
                    event12.resize.w = event20->window.data1;
                    event12.resize.h = event20->window.data2;
                    break;
                }

                case SDL_WINDOWEVENT_MINIMIZED:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 0;
                    event12.active.state = SDL12_APPACTIVE;
                    break;

                case SDL_WINDOWEVENT_RESTORED:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 1;
                    event12.active.state = SDL12_APPACTIVE;
                    break;

                case SDL_WINDOWEVENT_ENTER:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 1;
                    event12.active.state = SDL12_APPMOUSEFOCUS;
                    break;

                case SDL_WINDOWEVENT_LEAVE:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 0;
                    event12.active.state = SDL12_APPMOUSEFOCUS;
                    break;

                case SDL_WINDOWEVENT_FOCUS_GAINED:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 1;
                    event12.active.state = SDL12_APPINPUTFOCUS;
                    break;

                case SDL_WINDOWEVENT_FOCUS_LOST:
                    event12.type = SDL12_ACTIVEEVENT;
                    event12.active.gain = 0;
                    event12.active.state = SDL12_APPINPUTFOCUS;
                    break;
            }
            break;

        case SDL_SYSWMEVENT:
            if (!SupportSysWM) {
                return 1;
            }

            #if defined(SDL_VIDEO_DRIVER_WINDOWS)
                SDL_assert(event20->syswm.msg->subsystem == SDL_SYSWM_WINDOWS);
                msg.hwnd = event20->syswm.msg->msg.win.hwnd;
                msg.msg = event20->syswm.msg->msg.win.msg;
                msg.wParam = event20->syswm.msg->msg.win.wParam;
                msg.lParam = event20->syswm.msg->msg.win.lParam;
            #elif defined(SDL_VIDEO_DRIVER_X11)
                SDL_assert(event20->syswm.msg->subsystem == SDL_SYSWM_X11);
                msg.subsystem = SDL12_SYSWM_X11;
                SDL20_memcpy(&msg.event.xevent, &event20->syswm.msg->msg.x11.event, sizeof (XEvent));
            #else
                SDL_assert(!"should have been caught by !SupportsSysWM test");
            #endif

            SDL20_memcpy(&msg.version, SDL_Linked_Version(), sizeof (msg.version));
            event12.type = SDL12_SYSWMEVENT;
            event12.syswm.msg = &msg;  /* this is stack-allocated, but we copy and update the pointer later. */
            break;

        case SDL_KEYUP:
            if (event20->key.repeat) {
                return 1;  /* ignore 2.0-style key repeat events */
            }

            if (TranslateKeyboardLayout) {
                event12.key.keysym.sym = Keysym20to12(event20->key.keysym.sym);
            } else {
                event12.key.keysym.sym = Scancode20toKeysym12(event20->key.keysym.scancode);
            }

            if (KeyRepeatNextTicks) {
                SDL_assert(KeyRepeatEvent.type == SDL12_KEYDOWN);
                if (KeyRepeatEvent.key.keysym.sym == event12.key.keysym.sym) {
                    KeyRepeatNextTicks = 0;
                }
            }

            KeyState[event12.key.keysym.sym] = event20->key.state;

            event12.type = SDL12_KEYUP;
            event12.key.which = 0;
            event12.key.state = event20->key.state;
            /* turns out that some apps actually made use of the hardware scancodes (checking for platform beforehand) */
            event12.key.keysym.scancode = Scancode20to12(event20->key.keysym.scancode);
            event12.key.keysym.mod = event20->key.keysym.mod;  /* these match up between 1.2 and 2.0! */
            event12.key.keysym.unicode = 0;

            /* If there's a pending KEYDOWN event, flush it on KEYUP. */
            FlushPendingKeydownEvent(0);
            break;

        case SDL_KEYDOWN:
            FlushPendingKeydownEvent(0);
            if (event20->key.repeat) {
                return 1;  /* ignore 2.0-style key repeat events */
            }

            if (TranslateKeyboardLayout) {
                PendingKeydownEvent.key.keysym.sym = Keysym20to12(event20->key.keysym.sym);
            } else {
                PendingKeydownEvent.key.keysym.sym = Scancode20toKeysym12(event20->key.keysym.scancode);
            }

            KeyState[PendingKeydownEvent.key.keysym.sym] = event20->key.state;

            PendingKeydownEvent.type = (event20->type == SDL_KEYDOWN) ? SDL12_KEYDOWN : SDL12_KEYUP;
            PendingKeydownEvent.key.which = 0;
            PendingKeydownEvent.key.state = event20->key.state;
            /* turns out that some apps actually made use of the hardware scancodes (checking for platform beforehand) */
            PendingKeydownEvent.key.keysym.scancode = Scancode20to12(event20->key.keysym.scancode);
            PendingKeydownEvent.key.keysym.mod = event20->key.keysym.mod;  /* these match up between 1.2 and 2.0! */
            PendingKeydownEvent.key.keysym.unicode = 0;

            /* If Unicode is not enabled, flush all KEYDOWN events immediately. */
            if (!EnabledUnicode) {
                FlushPendingKeydownEvent(0);
                return 1;
            }

            /* some programs rely on unicode values for these control characters */
            switch (PendingKeydownEvent.key.keysym.sym) {
                case SDLK12_BACKSPACE:
                    FlushPendingKeydownEvent('\b');
                    break;
                case SDLK12_TAB:
                    FlushPendingKeydownEvent('\t');
                    break;
                case SDLK12_RETURN:
                case SDLK12_KP_ENTER:
                    /* Enter: \r, Shift+Enter: \n */
                    if (PendingKeydownEvent.key.keysym.mod & KMOD_SHIFT)
                        FlushPendingKeydownEvent('\n');
                    else
                        FlushPendingKeydownEvent('\r');
                    break;
                case SDLK12_ESCAPE:
                    FlushPendingKeydownEvent(0x1B); /* '\e' */
                    break;
                default:
                    /* not a supported control character
                       when CTRL is pressed, text events aren't sent so use fallback for unicode */
                    if (PendingKeydownEvent.key.keysym.mod & KMOD_CTRL) {
                        const char *keyName = SDL_GetKeyName(PendingKeydownEvent.key.keysym.sym);
                        /* use key name as unicode if it's a single character */
                        if (keyName[0] && !keyName[1])
                            FlushPendingKeydownEvent(keyName[0]);
                        else
                            FlushPendingKeydownEvent(0);
                    }
                    break;
            }

            return 1;

        case SDL_TEXTEDITING: return 1;
        case SDL_TEXTINPUT: {
            char *text = event20->text.text;
            const int codePoint = DecodeUTF8Char(&text);
            FlushPendingKeydownEvent(codePoint);
            return 1;
        }

        case SDL_MOUSEMOTION:
            if (!VideoSurface12 || !VideoSurface12->surface20) {
                return 1;  /* we don't have a screen surface yet? Don't send this on to the app. */
            }

            event12.type = SDL12_MOUSEMOTION;
            event12.motion.which = (Uint8) event20->motion.which;
            event12.motion.state = event20->motion.state;
            AdjustOpenGLLogicalScalingPoint(&event20->motion.x, &event20->motion.y);
            /* Clamp the absolute position to the window dimensions. */
            event20->motion.x = SDL_max(SDL_min(event20->motion.x, VideoSurface12->w), 0);
            event20->motion.y = SDL_max(SDL_min(event20->motion.y, VideoSurface12->h), 0);
            event12.motion.x = (Uint16) event20->motion.x;
            event12.motion.y = (Uint16) event20->motion.y;
            if (UseMouseRelativeScaling) {
                AdjustOpenGLLogicalScalingVector(&event20->motion.xrel,
                                                 &event20->motion.yrel,
                                                 &MouseRelativeRemainder.x,
                                                 &MouseRelativeRemainder.y);
            }
            event12.motion.xrel = (Sint16) event20->motion.xrel;
            event12.motion.yrel = (Sint16) event20->motion.yrel;
            if (MouseInputIsRelative) {
                /* in relative mode, clamp fake absolute position to the window dimensions. */
                #define ADJUST_RELATIVE(axis, rel, dim) { \
                    MousePosition.axis += event20->motion.rel; \
                    if (MousePosition.axis <= 0) { \
                        MousePosition.axis = 0; \
                    } else if (MousePosition.axis >= VideoSurface12->dim) { \
                        MousePosition.axis = (VideoSurface12->dim - 1); \
                    } \
                    event12.motion.axis = MousePosition.axis; \
                }
                ADJUST_RELATIVE(x, xrel, w);
                ADJUST_RELATIVE(y, yrel, h);
                #undef ADJUST_RELATIVE
            } else {
                MousePosition.x = event12.motion.x;
                MousePosition.y = event12.motion.y;
            }
            break;

        case SDL_MOUSEBUTTONDOWN:
            event12.type = SDL12_MOUSEBUTTONDOWN;
            event12.button.which = (Uint8) event20->button.which;
            event12.button.button = event20->button.button;
            if (event12.button.button > 3) {
                event12.button.button += 2; /* SDL_BUTTON_X1/2 */
            }
            event12.button.state = event20->button.state;
            if (MouseInputIsRelative) {
                /* If we're using relative mouse input, we need to use our "fake" position. */
                event12.button.x = MousePosition.x;
                event12.button.y = MousePosition.y;
            } else {
                AdjustOpenGLLogicalScalingPoint(&event20->button.x, &event20->button.y);
                event12.button.x = (Uint16) event20->button.x;
                event12.button.y = (Uint16) event20->button.y;
            }
            break;

        case SDL_MOUSEBUTTONUP:
            event12.type = SDL12_MOUSEBUTTONUP;
            event12.button.which = (Uint8) event20->button.which;
            event12.button.button = event20->button.button;
            if (event12.button.button > 3) {
                event12.button.button += 2; /* SDL_BUTTON_X1/2 */
            }
            event12.button.state = event20->button.state;
            if (MouseInputIsRelative) {
                /* If we're using relative mouse input, we need to use our "fake" position. */
                event12.button.x = MousePosition.x;
                event12.button.y = MousePosition.y;
            } else {
                AdjustOpenGLLogicalScalingPoint(&event20->button.x, &event20->button.y);
                event12.button.x = (Uint16) event20->button.x;
                event12.button.y = (Uint16) event20->button.y;
            }
            break;

        case SDL_MOUSEWHEEL:
            if (event20->wheel.y == 0) {
                break;  /* don't support horizontal wheels in 1.2. */
            }
            event12.type = SDL12_MOUSEBUTTONDOWN;
            event12.button.which = (Uint8) event20->wheel.which;
            event12.button.button = (event20->wheel.y > 0) ? 4 : 5;  /* wheelup is 4, down is 5. */
            event12.button.state = SDL_PRESSED;
            event12.button.x = MousePosition.x;
            event12.button.y = MousePosition.y;
            PushEventIfNotFiltered(&event12);

            event12.type = SDL12_MOUSEBUTTONUP;  /* immediately release mouse "button" at the end of this switch. */
            event12.button.state = SDL_RELEASED;
            break;

        case SDL_JOYAXISMOTION:
            if (!JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->jaxis.which);
                if (which != -1) {
                    event12.type = SDL12_JOYAXISMOTION;
                    event12.jaxis.which = (Uint8) which;
                    event12.jaxis.axis = event20->jaxis.axis;
                    event12.jaxis.value = event20->jaxis.value;
                }
            }
            break;

        case SDL_JOYBALLMOTION:
            if (!JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->jball.which);
                if (which != -1) {
                    event12.type = SDL12_JOYBALLMOTION;
                    event12.jball.which = (Uint8) which;
                    event12.jball.ball = event20->jball.ball;
                    event12.jball.xrel = event20->jball.xrel;
                    event12.jball.yrel = event20->jball.yrel;
                }
            }
            break;

        case SDL_JOYHATMOTION:
            if (!JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->jhat.which);
                if (which != -1) {
                    event12.type = SDL12_JOYHATMOTION;
                    event12.jhat.which = (Uint8) which;
                    event12.jhat.hat = event20->jhat.hat;
                    event12.jhat.value = event20->jhat.value;
                }
            }
            break;

        case SDL_JOYBUTTONDOWN:
        case SDL_JOYBUTTONUP:
            if (!JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->jbutton.which);
                if (which != -1) {
                    event12.type = (event20->jbutton.state) ? SDL12_JOYBUTTONDOWN : SDL12_JOYBUTTONUP;
                    event12.jbutton.which = (Uint8) which;
                    event12.jbutton.button = event20->jbutton.button;
                    event12.jbutton.state = event20->jbutton.state;
                }
            }
            break;

        case SDL_CONTROLLERAXISMOTION:
            if (JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->caxis.which);
                if (which != -1) {
                    event12.type = SDL12_JOYAXISMOTION;
                    event12.jaxis.which = (Uint8) which;
                    event12.jaxis.axis = event20->caxis.axis;
                    event12.jaxis.value = event20->caxis.value;
                }
            }
            break;

        case SDL_CONTROLLERBUTTONDOWN:
        case SDL_CONTROLLERBUTTONUP:
            if (JoysticksAreGameControllers) {
                const int which = FindJoystick12IndexByInstanceId(event20->cbutton.which);
                if (which != -1) {
                    event12.type = (event20->cbutton.state) ? SDL12_JOYBUTTONDOWN : SDL12_JOYBUTTONUP;
                    event12.jbutton.which = (Uint8) which;
                    event12.jbutton.button = event20->cbutton.button;
                    event12.jbutton.state = event20->cbutton.state;
                }
            }
            break;


        /*
        case SDL_JOYDEVICEADDED:
        case SDL_JOYDEVICEREMOVED:
        case SDL_CONTROLLERDEVICEADDED:
        case SDL_CONTROLLERDEVICEREMOVED:
        case SDL_CONTROLLERDEVICEREMAPPED:
        case SDL_FINGERDOWN:
        case SDL_FINGERUP:
        case SDL_FINGERMOTION:
        case SDL_DOLLARGESTURE:
        case SDL_DOLLARRECORD:
        case SDL_MULTIGESTURE:
        case SDL_CLIPBOARDUPDATE:
        case SDL_DROPFILE:
        */

        default:
            return 1;  /* drop everything else. */
    }

    PushEventIfNotFiltered(&event12);

    /* always pass it to the 2.0 event queue, as internal watchers (like the render API)
       might need to see these events to deal with logical scaling, etc. We've already
       copied it to the separate 1.2 event queue, and run the app's 1.2 event filter.
       Next time we call 1.2's SDL_PollEvent or SDL_PumpEvents(), we'll throw away the
       entire SDL2 event queue, as everything that cares about those will have then
       had a chance to examine it. */
    return 1;
}